

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int cm_zlib_deflate(z_streamp_conflict strm,int flush)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  deflate_state *s;
  Bytef *pBVar4;
  Bytef *pBVar5;
  Bytef *pBVar6;
  Posf *__s;
  bool bVar7;
  Bytef BVar8;
  uint uVar9;
  block_state bVar10;
  uLong uVar11;
  gz_headerp pgVar12;
  int iVar13;
  uInt uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uInt uVar18;
  
  if (strm == (z_streamp_conflict)0x0) {
    return -2;
  }
  s = (deflate_state *)strm->state;
  if (4 < (uint)flush || s == (deflate_state *)0x0) {
    return -2;
  }
  if ((strm->next_out == (Bytef *)0x0) ||
     (((strm->next_in == (Bytef *)0x0 && (strm->avail_in != 0)) ||
      (iVar13 = s->status, flush != 4 && iVar13 == 0x29a)))) {
    strm->msg = "stream error";
    return -2;
  }
  if (strm->avail_out == 0) goto LAB_0052a604;
  s->strm = strm;
  iVar1 = s->last_flush;
  s->last_flush = flush;
  if (iVar13 == 0x2a) {
    if (s->wrap != 2) {
      uVar9 = s->w_bits * 0x1000 - 0x7800;
      uVar16 = 0;
      if ((s->strategy < 2) && (uVar3 = s->level, uVar16 = 0, 1 < (int)uVar3)) {
        if (uVar3 < 6) {
          uVar16 = 0x40;
        }
        else {
          uVar16 = (uVar3 != 6 | 2) << 6;
        }
      }
      uVar3 = uVar16 + 0x20 + uVar9;
      if (s->strstart == 0) {
        uVar3 = uVar16 | uVar9;
      }
      s->status = 0x71;
      putShortMSB(s,(uVar3 | uVar3 % 0x1f) ^ 0x1f);
      if (s->strstart != 0) {
        putShortMSB(s,*(uInt *)((long)&strm->adler + 2));
        putShortMSB(s,(uint)(ushort)strm->adler);
      }
      uVar11 = cm_zlib_adler32(0,(Bytef *)0x0,0);
      strm->adler = uVar11;
      iVar13 = s->status;
      goto LAB_0052a309;
    }
    uVar11 = cm_zlib_crc32(0,(uchar *)0x0,0);
    strm->adler = uVar11;
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = '\x1f';
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = 0x8b;
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = '\b';
    pgVar12 = s->gzhead;
    if (pgVar12 != (gz_headerp)0x0) {
      iVar13 = pgVar12->text;
      iVar2 = pgVar12->hcrc;
      pBVar4 = pgVar12->extra;
      pBVar5 = pgVar12->name;
      pBVar6 = pgVar12->comment;
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] =
           (pBVar6 != (Bytef *)0x0) << 4 |
           (pBVar5 != (Bytef *)0x0) << 3 |
           (pBVar4 != (Bytef *)0x0) << 2 | (iVar2 != 0) * '\x02' | iVar13 != 0;
      uVar11 = s->gzhead->time;
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = (Bytef)uVar11;
      BVar8 = *(Bytef *)((long)&s->gzhead->time + 1);
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = BVar8;
      BVar8 = *(Bytef *)((long)&s->gzhead->time + 2);
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = BVar8;
      BVar8 = *(Bytef *)((long)&s->gzhead->time + 3);
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = BVar8;
      BVar8 = '\x02';
      if (s->level != 9) {
        BVar8 = (s->level < 2 || 1 < s->strategy) << 2;
      }
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = BVar8;
      iVar13 = s->gzhead->os;
      uVar16 = s->pending;
      s->pending = uVar16 + 1;
      s->pending_buf[uVar16] = (Bytef)iVar13;
      pgVar12 = s->gzhead;
      if (pgVar12->extra != (Bytef *)0x0) {
        uVar14 = pgVar12->extra_len;
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = (Bytef)uVar14;
        BVar8 = *(Bytef *)((long)&s->gzhead->extra_len + 1);
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = BVar8;
        pgVar12 = s->gzhead;
      }
      if (pgVar12->hcrc != 0) {
        uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf,s->pending);
        strm->adler = uVar11;
      }
      s->gzindex = 0;
      s->status = 0x45;
      goto LAB_0052a312;
    }
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = '\0';
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = '\0';
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = '\0';
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = '\0';
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = '\0';
    BVar8 = '\x02';
    if (s->level != 9) {
      BVar8 = (s->level < 2 || 1 < s->strategy) << 2;
    }
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = BVar8;
    uVar16 = s->pending;
    s->pending = uVar16 + 1;
    s->pending_buf[uVar16] = '\x03';
LAB_0052a5bf:
    s->status = 0x71;
  }
  else {
LAB_0052a309:
    if (iVar13 == 0x45) {
LAB_0052a312:
      pgVar12 = s->gzhead;
      if (pgVar12->extra != (Bytef *)0x0) {
        uVar14 = s->pending;
        uVar18 = s->gzindex;
        while (uVar18 < (ushort)pgVar12->extra_len) {
          uVar16 = s->pending;
          uVar17 = (ulong)uVar16;
          if (s->pending_buf_size == uVar17) {
            if ((pgVar12->hcrc != 0) && (uVar14 <= uVar16 && uVar16 - uVar14 != 0)) {
              uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar14,uVar16 - uVar14);
              strm->adler = uVar11;
            }
            flush_pending(strm);
            uVar14 = s->pending;
            uVar17 = (ulong)uVar14;
            pgVar12 = s->gzhead;
            if (s->pending_buf_size == uVar17) break;
            uVar18 = s->gzindex;
          }
          BVar8 = pgVar12->extra[uVar18];
          s->pending = (int)uVar17 + 1;
          s->pending_buf[uVar17] = BVar8;
          uVar18 = s->gzindex + 1;
          s->gzindex = uVar18;
          pgVar12 = s->gzhead;
        }
        if ((pgVar12->hcrc != 0) &&
           (uVar16 = s->pending - uVar14, uVar14 <= s->pending && uVar16 != 0)) {
          uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar14,uVar16);
          strm->adler = uVar11;
          pgVar12 = s->gzhead;
        }
        if (s->gzindex != pgVar12->extra_len) {
          iVar13 = s->status;
          goto LAB_0052a3d2;
        }
        s->gzindex = 0;
      }
      s->status = 0x49;
LAB_0052a3df:
      if (pgVar12->name != (Bytef *)0x0) {
        uVar14 = s->pending;
        do {
          uVar16 = s->pending;
          uVar17 = (ulong)uVar16;
          pgVar12 = s->gzhead;
          if (s->pending_buf_size == uVar17) {
            if ((pgVar12->hcrc != 0) && (uVar14 <= uVar16 && uVar16 - uVar14 != 0)) {
              uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar14,uVar16 - uVar14);
              strm->adler = uVar11;
            }
            flush_pending(strm);
            uVar14 = s->pending;
            uVar17 = (ulong)uVar14;
            if (s->pending_buf_size == uVar17) {
              bVar7 = false;
              goto LAB_0052a45a;
            }
            pgVar12 = s->gzhead;
          }
          pBVar4 = pgVar12->name;
          uVar16 = s->gzindex;
          s->gzindex = uVar16 + 1;
          BVar8 = pBVar4[uVar16];
          s->pending = (int)uVar17 + 1;
          s->pending_buf[uVar17] = BVar8;
        } while (BVar8 != '\0');
        bVar7 = true;
        uVar17 = (ulong)uVar14;
LAB_0052a45a:
        if ((s->gzhead->hcrc != 0) &&
           (uVar16 = s->pending - (uint)uVar17, (uint)uVar17 <= s->pending && uVar16 != 0)) {
          uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar17,uVar16);
          strm->adler = uVar11;
        }
        if (!bVar7) {
          iVar13 = s->status;
          goto LAB_0052a495;
        }
        s->gzindex = 0;
      }
      s->status = 0x5b;
LAB_0052a49e:
      if (s->gzhead->comment != (Bytef *)0x0) {
        uVar14 = s->pending;
        do {
          uVar16 = s->pending;
          uVar17 = (ulong)uVar16;
          pgVar12 = s->gzhead;
          if (s->pending_buf_size == uVar17) {
            if ((pgVar12->hcrc != 0) && (uVar14 <= uVar16 && uVar16 - uVar14 != 0)) {
              uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar14,uVar16 - uVar14);
              strm->adler = uVar11;
            }
            flush_pending(strm);
            uVar14 = s->pending;
            uVar17 = (ulong)uVar14;
            if (s->pending_buf_size == uVar17) {
              bVar7 = false;
              goto LAB_0052a51d;
            }
            pgVar12 = s->gzhead;
          }
          pBVar4 = pgVar12->comment;
          uVar16 = s->gzindex;
          s->gzindex = uVar16 + 1;
          BVar8 = pBVar4[uVar16];
          s->pending = (int)uVar17 + 1;
          s->pending_buf[uVar17] = BVar8;
        } while (BVar8 != '\0');
        bVar7 = true;
        uVar17 = (ulong)uVar14;
LAB_0052a51d:
        if ((s->gzhead->hcrc != 0) &&
           (uVar16 = s->pending - (uint)uVar17, (uint)uVar17 <= s->pending && uVar16 != 0)) {
          uVar11 = cm_zlib_crc32(strm->adler,s->pending_buf + uVar17,uVar16);
          strm->adler = uVar11;
        }
        if (!bVar7) {
          iVar13 = s->status;
          goto LAB_0052a554;
        }
      }
      s->status = 0x67;
LAB_0052a559:
      if (s->gzhead->hcrc != 0) {
        uVar14 = s->pending;
        uVar15 = (ulong)(uVar14 + 2);
        uVar17 = s->pending_buf_size;
        if (uVar17 < uVar15) {
          flush_pending(strm);
          uVar14 = s->pending;
          uVar17 = s->pending_buf_size;
          uVar15 = (ulong)(uVar14 + 2);
        }
        if (uVar17 < uVar15) goto LAB_0052a5c6;
        uVar11 = strm->adler;
        s->pending = uVar14 + 1;
        s->pending_buf[uVar14] = (Bytef)uVar11;
        BVar8 = *(Bytef *)((long)&strm->adler + 1);
        uVar16 = s->pending;
        s->pending = uVar16 + 1;
        s->pending_buf[uVar16] = BVar8;
        uVar11 = cm_zlib_crc32(0,(uchar *)0x0,0);
        strm->adler = uVar11;
      }
      goto LAB_0052a5bf;
    }
LAB_0052a3d2:
    if (iVar13 == 0x49) {
      pgVar12 = s->gzhead;
      goto LAB_0052a3df;
    }
LAB_0052a495:
    if (iVar13 == 0x5b) goto LAB_0052a49e;
LAB_0052a554:
    if (iVar13 == 0x67) goto LAB_0052a559;
  }
LAB_0052a5c6:
  if (s->pending == 0) {
    if (((strm->avail_in == 0) && (flush != 4)) && (flush <= iVar1)) goto LAB_0052a604;
LAB_0052a5df:
    if (s->status == 0x29a) {
      if (strm->avail_in != 0) {
LAB_0052a604:
        strm->msg = "buffer error";
        return -5;
      }
LAB_0052a61f:
      if (s->lookahead != 0) goto LAB_0052a628;
      if (flush == 0) {
        return 0;
      }
      if (s->status != 0x29a) goto LAB_0052a628;
    }
    else {
      if (strm->avail_in == 0) goto LAB_0052a61f;
LAB_0052a628:
      bVar10 = (*configuration_table[s->level].func)(s,flush);
      if ((bVar10 & ~block_done) == finish_started) {
        s->status = 0x29a;
      }
      if ((bVar10 & ~finish_started) == need_more) {
        if (strm->avail_out == 0) {
          s->last_flush = -1;
          return 0;
        }
        return 0;
      }
      if (bVar10 == block_done) {
        if (flush == 1) {
          cm_zlib__tr_align(s);
        }
        else {
          cm_zlib__tr_stored_block(s,(charf *)0x0,0,0);
          if (flush == 3) {
            __s = s->head;
            uVar17 = (ulong)(s->hash_size - 1);
            __s[uVar17] = 0;
            memset(__s,0,uVar17 * 2);
          }
        }
        flush_pending(strm);
        if (strm->avail_out == 0) goto LAB_0052a791;
      }
    }
    if (flush == 4) {
      if (0 < s->wrap) {
        uVar11 = strm->adler;
        if (s->wrap == 2) {
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = (Bytef)uVar11;
          BVar8 = *(Bytef *)((long)&strm->adler + 1);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = BVar8;
          BVar8 = *(Bytef *)((long)&strm->adler + 2);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = BVar8;
          BVar8 = *(Bytef *)((long)&strm->adler + 3);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = BVar8;
          uVar11 = strm->total_in;
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = (Bytef)uVar11;
          BVar8 = *(Bytef *)((long)&strm->total_in + 1);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = BVar8;
          BVar8 = *(Bytef *)((long)&strm->total_in + 2);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = BVar8;
          BVar8 = *(Bytef *)((long)&strm->total_in + 3);
          uVar16 = s->pending;
          s->pending = uVar16 + 1;
          s->pending_buf[uVar16] = BVar8;
        }
        else {
          putShortMSB(s,(uInt)(uVar11 >> 0x10));
          putShortMSB(s,(uint)(ushort)strm->adler);
        }
        flush_pending(strm);
        if (0 < s->wrap) {
          s->wrap = -s->wrap;
        }
        return (uint)(s->pending == 0);
      }
      return 1;
    }
  }
  else {
    flush_pending(strm);
    if (strm->avail_out != 0) goto LAB_0052a5df;
LAB_0052a791:
    s->last_flush = -1;
  }
  return 0;
}

Assistant:

int ZEXPORT deflate (strm, flush)
    z_streamp strm;
    int flush;
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        flush > Z_FINISH || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->next_in == Z_NULL && strm->avail_in != 0) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    s->strm = strm; /* just in case */
    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Write the header */
    if (s->status == INIT_STATE) {
#ifdef GZIP
        if (s->wrap == 2) {
            strm->adler = crc32(0L, Z_NULL, 0);
            put_byte(s, 31);
            put_byte(s, 139);
            put_byte(s, 8);
            if (s->gzhead == NULL) {
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, OS_CODE);
                s->status = BUSY_STATE;
            }
            else {
                put_byte(s, (s->gzhead->text ? 1 : 0) +
                            (s->gzhead->hcrc ? 2 : 0) +
                            (s->gzhead->extra == Z_NULL ? 0 : 4) +
                            (s->gzhead->name == Z_NULL ? 0 : 8) +
                            (s->gzhead->comment == Z_NULL ? 0 : 16)
                        );
                put_byte(s, (Byte)(s->gzhead->time & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, s->gzhead->os & 0xff);
                if (s->gzhead->extra != NULL) {
                    put_byte(s, s->gzhead->extra_len & 0xff);
                    put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
                }
                if (s->gzhead->hcrc)
                    strm->adler = crc32(strm->adler, s->pending_buf,
                                        s->pending);
                s->gzindex = 0;
                s->status = EXTRA_STATE;
            }
        }
        else
#endif
        {
            uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
            uInt level_flags;

            if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
                level_flags = 0;
            else if (s->level < 6)
                level_flags = 1;
            else if (s->level == 6)
                level_flags = 2;
            else
                level_flags = 3;
            header |= (level_flags << 6);
            if (s->strstart != 0) header |= PRESET_DICT;
            header += 31 - (header % 31);

            s->status = BUSY_STATE;
            putShortMSB(s, header);

            /* Save the adler32 of the preset dictionary: */
            if (s->strstart != 0) {
                putShortMSB(s, (uInt)(strm->adler >> 16));
                putShortMSB(s, (uInt)(strm->adler & 0xffff));
            }
            strm->adler = adler32(0L, Z_NULL, 0);
        }
    }
#ifdef GZIP
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */

            while (s->gzindex < (s->gzhead->extra_len & 0xffff)) {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size)
                        break;
                }
                put_byte(s, s->gzhead->extra[s->gzindex]);
                s->gzindex++;
            }
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (s->gzindex == s->gzhead->extra_len) {
                s->gzindex = 0;
                s->status = NAME_STATE;
            }
        }
        else
            s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0) {
                s->gzindex = 0;
                s->status = COMMENT_STATE;
            }
        }
        else
            s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0)
                s->status = HCRC_STATE;
        }
        else
            s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size)
                flush_pending(strm);
            if (s->pending + 2 <= s->pending_buf_size) {
                put_byte(s, (Byte)(strm->adler & 0xff));
                put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
                strm->adler = crc32(0L, Z_NULL, 0);
                s->status = BUSY_STATE;
            }
        }
        else
            s->status = BUSY_STATE;
    }
#endif

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && flush <= old_flush &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }
    Assert(strm->avail_out > 0, "bug2");

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}